

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

int __thiscall ktx::OptionsSingleIn::init(OptionsSingleIn *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  OptionAdder *this_00;
  allocator<char> local_1c7;
  allocator<char> local_1c6;
  allocator<char> local_1c5;
  allocator<char> local_1c4;
  allocator<char> local_1c3;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  undefined1 local_1c0 [40];
  element_type *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  shared_ptr<const_cxxopts::Value> local_188;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  shared_ptr<const_cxxopts::Value> local_168;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_1c1);
  cxxopts::Options::add_options((OptionAdder *)local_1c0,(Options *)ctx,&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"stdin",&local_1c2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "Use stdin as the input file. (Using a single dash \'-\' as the input file has the same effect)"
             ,&local_1c3);
  cxxopts::value<bool>();
  local_168.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_178;
  local_168.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_170._M_pi;
  local_178 = (element_type *)0x0;
  _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_1c4);
  this_00 = cxxopts::OptionAdder::operator()
                      ((OptionAdder *)local_1c0,&local_90,&local_b0,&local_168,&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"i,input-file",&local_1c5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "The input file. Using a single dash \'-\' as the input file will use stdin.",
             &local_1c6);
  cxxopts::value<std::__cxx11::string>();
  local_188.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_198;
  local_188.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_190._M_pi;
  local_198 = (element_type *)0x0;
  _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"filepath",&local_1c7);
  cxxopts::OptionAdder::operator()(this_00,&local_f0,&local_110,&local_188,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_190);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_168.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_170);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"input-file",(allocator<char> *)local_1c0);
  cxxopts::Options::parse_positional((Options *)ctx,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"<input-file>",(allocator<char> *)local_1c0);
  std::__cxx11::string::operator=((string *)(ctx + 0x60),local_50);
  iVar1 = std::__cxx11::string::~string(local_50);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options()
                ("stdin", "Use stdin as the input file. (Using a single dash '-' as the input file has the same effect)")
                ("i,input-file", "The input file. Using a single dash '-' as the input file will use stdin.", cxxopts::value<std::string>(), "filepath");
        opts.parse_positional("input-file");
        opts.positional_help("<input-file>");
    }